

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintStatement.h
# Opt level: O2

void __thiscall PrintStatement::execute(PrintStatement *this,Environment *env)

{
  element_type *peVar1;
  ThrowPacket *pTVar2;
  allocator<char> local_69;
  string local_68 [32];
  ptr<Value> value;
  string local_38;
  
  peVar1 = (this->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    pTVar2 = (ThrowPacket *)__cxa_allocate_exception(0x10,0,env);
    std::__cxx11::string::string<std::allocator<char>>
              (local_68,"Value is null",(allocator<char> *)&value);
    ExceptionObjects::null_value((string *)&local_38.field_2);
    ThrowPacket::ThrowPacket(pTVar2,(ptr<Value> *)&local_38.field_2);
    __cxa_throw(pTVar2,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
  }
  (**peVar1->_vptr_Expression)(&value);
  if (value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    (*((value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Member).
      _vptr_Member[2])(local_68);
    std::operator<<((ostream *)&std::cout,local_68);
    std::__cxx11::string::~string(local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  pTVar2 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"Value is null",&local_69);
  ExceptionObjects::null_value(&local_38);
  ThrowPacket::ThrowPacket(pTVar2,(ptr<Value> *)&local_38);
  __cxa_throw(pTVar2,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

void execute(Environment *env) override {
        if(!expression)
            throw ThrowPacket(ExceptionObjects::null_value("Value is null"));
        ptr<Value> value = expression -> evaluate(env);
        if(!value)
            throw ThrowPacket(ExceptionObjects::null_value("Value is null"));

        std::cout << value -> asString();
    }